

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

bool __thiscall FMultiBlockLinesIterator::GoDown(FMultiBlockLinesIterator *this,double x,double y)

{
  bool bVar1;
  int group;
  double y_local;
  double x_local;
  FMultiBlockLinesIterator *this_local;
  
  if ((this->continuedown & 1U) != 0) {
    bVar1 = sector_t::PortalBlocksMovement(this->cursector,0);
    if (!bVar1) {
      group = sector_t::GetOppositePortalGroup(this->cursector,0);
      startIteratorForGroup(this,group);
      this->portalflags = 0x40;
      return true;
    }
    this->continuedown = false;
  }
  return false;
}

Assistant:

bool FMultiBlockLinesIterator::GoDown(double x, double y)
{
	if (continuedown)
	{
		if (!cursector->PortalBlocksMovement(sector_t::floor))
		{
			startIteratorForGroup(cursector->GetOppositePortalGroup(sector_t::floor));
			portalflags = FFCF_NOCEILING;
			return true;
		}
		else continuedown = false;
	}
	return false;
}